

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_signature_algorithms(st_ptls_signature_algorithms_t *sa,uint8_t **src,uint8_t *end)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong uVar7;
  
  puVar3 = *src;
  iVar5 = 0x32;
  if (1 < (ulong)((long)end - (long)puVar3)) {
    *src = puVar3 + 1;
    uVar1 = *puVar3;
    puVar6 = puVar3 + 2;
    *src = puVar6;
    uVar7 = (ulong)CONCAT11(uVar1,puVar3[1]);
    if (uVar7 <= (ulong)((long)end - (long)puVar6)) {
      puVar3 = puVar6 + uVar7;
      do {
        if ((long)uVar7 < 2) {
          return 0x32;
        }
        uVar1 = *puVar6;
        uVar2 = puVar6[1];
        puVar6 = puVar6 + 2;
        *src = puVar6;
        uVar4 = sa->count;
        if (uVar4 < 0x10) {
          sa->count = uVar4 + 1;
          sa->list[uVar4] = CONCAT11(uVar1,uVar2);
        }
        uVar7 = uVar7 - 2;
      } while (puVar6 != puVar3);
      iVar5 = 0x32;
      if (puVar3 == end) {
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

static int decode_signature_algorithms(struct st_ptls_signature_algorithms_t *sa, const uint8_t **src, const uint8_t *end)
{
    int ret;

    ptls_decode_block(*src, end, 2, {
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, src, end)) != 0)
                goto Exit;
            if (sa->count < PTLS_ELEMENTSOF(sa->list))
                sa->list[sa->count++] = id;
        } while (*src != end);
    });

    ret = 0;
Exit:
    return ret;
}